

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void __thiscall TestRunner::RunAll(TestRunner *this,TestCase **array,int numTests)

{
  bool bVar1;
  int local_20;
  int i;
  int numTests_local;
  TestCase **array_local;
  TestRunner *this_local;
  
  local_20 = 0;
  while( true ) {
    if (numTests <= local_20) {
      return;
    }
    bVar1 = TestCase::Start(array[local_20]);
    if (!bVar1) break;
    if (array[local_20] != (TestCase *)0x0) {
      (*array[local_20]->_vptr_TestCase[1])();
    }
    local_20 = local_20 + 1;
  }
  exit(1);
}

Assistant:

void RunAll( TestCase **array, int numTests )
	{
		for( int i = 0; i < numTests; i++ )
		{
			LOG_NOTICE( "Running test %s", array[ i ]->GetTestName() );
			if ( array[ i ]->Start() == false )
			{
				exit( EXIT_FAILURE );
			}
			delete array[ i ];
		}
	}